

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

void anon_unknown.dwarf_7427e9::AddInstallRuntimeDependenciesGenerator
               (Helper *helper,cmInstallRuntimeDependencySet *runtimeDependencySet,
               cmInstallCommandArguments *runtimeArgs,cmInstallCommandArguments *libraryArgs,
               cmInstallCommandArguments *frameworkArgs,
               RuntimeDependenciesArgs *runtimeDependenciesArgs,bool *installsRuntime,
               bool *installsLibrary,bool *installsFramework)

{
  cmMakefile *pcVar1;
  byte bVar2;
  bool bVar3;
  string *psVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  const_iterator __first;
  const_iterator __last;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __result;
  string *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  string *__args_13;
  bool local_310;
  bool local_30e;
  cmInstallCommandArguments *local_298;
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> local_248;
  undefined1 local_240 [24];
  MessageLevel local_228;
  char local_221;
  string local_220 [39];
  undefined1 local_1f9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  undefined4 local_1dc;
  unique_ptr<cmInstallRuntimeDependencySetGenerator,_std::default_delete<cmInstallRuntimeDependencySetGenerator>_>
  local_1d8;
  __single_object frameworkRuntimeDependenciesGenerator;
  undefined1 local_1c8 [20];
  MessageLevel local_1b4;
  string local_1b0;
  char local_189;
  string local_188 [39];
  undefined1 local_161 [29];
  undefined8 local_144;
  __single_object libraryRuntimeDependenciesGenerator;
  undefined1 local_130 [23];
  undefined1 local_119;
  MessageLevel local_118;
  char local_113;
  byte local_112;
  allocator<char> local_111;
  string local_110 [32];
  unique_ptr<cmInstallGetRuntimeDependenciesGenerator,_std::default_delete<cmInstallGetRuntimeDependenciesGenerator>_>
  local_f0;
  __single_object getRuntimeDependenciesGenerator;
  undefined1 local_c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurations;
  cmInstallCommandArguments *runtimeDependenciesArgsRef;
  string local_a0;
  undefined1 local_7d;
  bool apple;
  allocator<char> local_69;
  string local_68;
  byte local_41;
  RuntimeDependenciesArgs *pRStack_40;
  bool dllPlatform;
  RuntimeDependenciesArgs *runtimeDependenciesArgs_local;
  cmInstallCommandArguments *frameworkArgs_local;
  cmInstallCommandArguments *libraryArgs_local;
  cmInstallCommandArguments *runtimeArgs_local;
  cmInstallRuntimeDependencySet *runtimeDependencySet_local;
  Helper *helper_local;
  
  pcVar1 = helper->Makefile;
  pRStack_40 = runtimeDependenciesArgs;
  runtimeDependenciesArgs_local = (RuntimeDependenciesArgs *)frameworkArgs;
  frameworkArgs_local = libraryArgs;
  libraryArgs_local = runtimeArgs;
  runtimeArgs_local = (cmInstallCommandArguments *)runtimeDependencySet;
  runtimeDependencySet_local = (cmInstallRuntimeDependencySet *)helper;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_IMPORT_LIBRARY_SUFFIX",&local_69);
  cmMakefile::GetSafeDefinition(pcVar1,&local_68);
  bVar2 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  pcVar1 = (cmMakefile *)(runtimeDependencySet_local->Name)._M_string_length;
  local_41 = bVar2 ^ 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"CMAKE_HOST_SYSTEM_NAME",
             (allocator<char> *)((long)&runtimeDependenciesArgsRef + 7));
  psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_a0);
  bVar3 = std::operator==(psVar4,"Darwin");
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&runtimeDependenciesArgsRef + 7));
  if ((local_41 & 1) == 0) {
    local_298 = frameworkArgs_local;
  }
  else {
    local_298 = libraryArgs_local;
  }
  configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_298;
  local_7d = bVar3;
  pvVar5 = cmInstallCommandArguments::GetConfigurations_abi_cxx11_(local_298);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_c8,pvVar5);
  if ((local_7d & 1) != _S_red >> 0x18) {
    pvVar5 = cmInstallCommandArguments::GetConfigurations_abi_cxx11_
                       ((cmInstallCommandArguments *)runtimeDependenciesArgs_local);
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin(pvVar5);
    pvVar5 = cmInstallCommandArguments::GetConfigurations_abi_cxx11_
                       ((cmInstallCommandArguments *)runtimeDependenciesArgs_local);
    __last = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(pvVar5);
    __result = std::
               back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                         ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_c8);
    getRuntimeDependenciesGenerator._M_t.
    super___uniq_ptr_impl<cmInstallGetRuntimeDependenciesGenerator,_std::default_delete<cmInstallGetRuntimeDependenciesGenerator>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmInstallGetRuntimeDependenciesGenerator_*,_std::default_delete<cmInstallGetRuntimeDependenciesGenerator>_>
    .super__Head_base<0UL,_cmInstallGetRuntimeDependenciesGenerator_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmInstallGetRuntimeDependenciesGenerator,_std::default_delete<cmInstallGetRuntimeDependenciesGenerator>,_true,_true>
          )std::
           copy<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                     ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )__first._M_current,
                      (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )__last._M_current,__result);
  }
  psVar4 = cmInstallCommandArguments::GetComponent_abi_cxx11_
                     ((cmInstallCommandArguments *)
                      configurations.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_112 = 0;
  if ((local_7d & 1) == _S_red >> 0x18) {
    std::allocator<char>::allocator();
    local_112 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_110,"",&local_111);
  }
  else {
    psVar6 = cmInstallCommandArguments::GetComponent_abi_cxx11_
                       ((cmInstallCommandArguments *)runtimeDependenciesArgs_local);
    std::__cxx11::string::string(local_110,(string *)psVar6);
  }
  local_113 = '\x01';
  local_118 = cmInstallGenerator::SelectMessageLevel
                        ((cmMakefile *)(runtimeDependencySet_local->Name)._M_string_length,false);
  bVar3 = cmInstallCommandArguments::GetExcludeFromAll
                    ((cmInstallCommandArguments *)
                     configurations.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_30e = false;
  if (bVar3) {
    if ((local_7d & 1) == _S_red >> 0x18) {
      local_310 = true;
    }
    else {
      local_310 = cmInstallCommandArguments::GetExcludeFromAll
                            ((cmInstallCommandArguments *)runtimeDependenciesArgs_local);
    }
    local_30e = local_310;
  }
  local_119 = local_30e;
  cmMakefile::GetBacktrace((cmMakefile *)local_130);
  std::
  make_unique<cmInstallGetRuntimeDependenciesGenerator,cmInstallRuntimeDependencySet*&,ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string_const&,std::__cxx11::string_const,bool,char_const(&)[12],char_const(&)[13],std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,cmInstallGenerator::MessageLevel,bool,cmListFileBacktrace>
            ((cmInstallRuntimeDependencySet **)&local_f0,
             (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&runtimeArgs_local,&runtimeDependenciesArgs->Directories,
             &runtimeDependenciesArgs->PreIncludeRegexes,&runtimeDependenciesArgs->PreExcludeRegexes
             ,&runtimeDependenciesArgs->PostIncludeRegexes,
             &runtimeDependenciesArgs->PostExcludeRegexes,&runtimeDependenciesArgs->PostIncludeFiles
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &runtimeDependenciesArgs->PostExcludeFiles,psVar4,(bool *)local_110,
             (char (*) [12])&local_113,(char (*) [13])"_CMAKE_DEPS",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)"_CMAKE_RPATH",(MessageLevel *)local_c8,(bool *)&local_118,
             (cmListFileBacktrace *)&local_119);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_130);
  std::__cxx11::string::~string(local_110);
  if ((local_112 & 1) != 0) {
    std::allocator<char>::~allocator(&local_111);
  }
  pcVar1 = (cmMakefile *)(runtimeDependencySet_local->Name)._M_string_length;
  std::unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>>::
  unique_ptr<cmInstallGetRuntimeDependenciesGenerator,std::default_delete<cmInstallGetRuntimeDependenciesGenerator>,void>
            ((unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>> *)
             &libraryRuntimeDependenciesGenerator,&local_f0);
  cmMakefile::AddInstallGenerator
            (pcVar1,(unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
                    &libraryRuntimeDependenciesGenerator);
  std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>::~unique_ptr
            ((unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
             &libraryRuntimeDependenciesGenerator);
  local_144._0_4_ = 0;
  memset((void *)((long)local_161 + 1),0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)local_161 + 1));
  local_161[0] = (_Alloc_hider)0x1;
  std::__cxx11::string::string(local_188);
  local_189 = '\x01';
  if ((local_41 & 1) == 0) {
    (anonymous_namespace)::Helper::GetLibraryDestination_abi_cxx11_
              (&local_1b0,runtimeDependencySet_local,frameworkArgs_local);
  }
  else {
    (anonymous_namespace)::Helper::GetRuntimeDestination_abi_cxx11_
              (&local_1b0,runtimeDependencySet_local,libraryArgs_local);
  }
  pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           cmInstallCommandArguments::GetConfigurations_abi_cxx11_
                     ((cmInstallCommandArguments *)
                      configurations.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  psVar4 = cmInstallCommandArguments::GetComponent_abi_cxx11_
                     ((cmInstallCommandArguments *)
                      configurations.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  psVar6 = cmInstallCommandArguments::GetPermissions_abi_cxx11_
                     ((cmInstallCommandArguments *)
                      configurations.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_1b4 = cmInstallGenerator::SelectMessageLevel
                        ((cmMakefile *)(runtimeDependencySet_local->Name)._M_string_length,false);
  local_1c8[0x13] =
       cmInstallCommandArguments::GetExcludeFromAll
                 ((cmInstallCommandArguments *)
                  configurations.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmMakefile::GetBacktrace((cmMakefile *)local_1c8);
  std::
  make_unique<cmInstallRuntimeDependencySetGenerator,cmInstallRuntimeDependencySetGenerator::DependencyType,cmInstallRuntimeDependencySet*&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,bool,std::__cxx11::string,bool,char_const(&)[12],char_const(&)[13],char_const(&)[11],std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmInstallGenerator::MessageLevel,bool,cmListFileBacktrace>
            ((DependencyType *)((long)&local_144 + 4),(cmInstallRuntimeDependencySet **)&local_144,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&runtimeArgs_local,(bool *)((long)local_161 + 1),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_161,
             (bool *)local_188,(char (*) [12])&local_189,(char (*) [13])"_CMAKE_DEPS",
             (char (*) [11])"_CMAKE_RPATH",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"_CMAKE_TMP",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1b0,pbVar7,psVar4,(MessageLevel *)psVar6,(bool *)&local_1b4,
             (cmListFileBacktrace *)(local_1c8 + 0x13));
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1c8);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string(local_188);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)local_161 + 1));
  pcVar1 = (cmMakefile *)(runtimeDependencySet_local->Name)._M_string_length;
  std::unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>>::
  unique_ptr<cmInstallRuntimeDependencySetGenerator,std::default_delete<cmInstallRuntimeDependencySetGenerator>,void>
            ((unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>> *)
             &frameworkRuntimeDependenciesGenerator,
             (unique_ptr<cmInstallRuntimeDependencySetGenerator,_std::default_delete<cmInstallRuntimeDependencySetGenerator>_>
              *)((long)&local_144 + 4));
  cmMakefile::AddInstallGenerator
            (pcVar1,(unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
                    &frameworkRuntimeDependenciesGenerator);
  std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>::~unique_ptr
            ((unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
             &frameworkRuntimeDependenciesGenerator);
  if ((local_41 & 1) == 0) {
    *installsLibrary = true;
  }
  else {
    *installsRuntime = true;
  }
  if ((local_7d & 1) != _S_red >> 0x18) {
    local_1dc = 1;
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1f8);
    local_1f9 = (_Alloc_hider)0x1;
    std::__cxx11::string::string(local_220);
    local_221 = '\x01';
    psVar4 = cmInstallCommandArguments::GetDestination_abi_cxx11_
                       ((cmInstallCommandArguments *)runtimeDependenciesArgs_local);
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             cmInstallCommandArguments::GetConfigurations_abi_cxx11_
                       ((cmInstallCommandArguments *)runtimeDependenciesArgs_local);
    psVar6 = cmInstallCommandArguments::GetComponent_abi_cxx11_
                       ((cmInstallCommandArguments *)runtimeDependenciesArgs_local);
    __args_13 = cmInstallCommandArguments::GetPermissions_abi_cxx11_
                          ((cmInstallCommandArguments *)runtimeDependenciesArgs_local);
    local_228 = cmInstallGenerator::SelectMessageLevel
                          ((cmMakefile *)(runtimeDependencySet_local->Name)._M_string_length,false);
    local_240[0x17] =
         cmInstallCommandArguments::GetExcludeFromAll
                   ((cmInstallCommandArguments *)runtimeDependenciesArgs_local);
    cmMakefile::GetBacktrace((cmMakefile *)local_240);
    std::
    make_unique<cmInstallRuntimeDependencySetGenerator,cmInstallRuntimeDependencySetGenerator::DependencyType,cmInstallRuntimeDependencySet*&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,bool,std::__cxx11::string,bool,char_const(&)[12],char_const(&)[13],char_const(&)[11],std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmInstallGenerator::MessageLevel,bool,cmListFileBacktrace>
              ((DependencyType *)&local_1d8,(cmInstallRuntimeDependencySet **)&local_1dc,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&runtimeArgs_local,(bool *)&local_1f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f9,
               (bool *)local_220,(char (*) [12])&local_221,(char (*) [13])"_CMAKE_DEPS",
               (char (*) [11])"_CMAKE_RPATH",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"_CMAKE_TMP",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)psVar4,pbVar7,psVar6,(MessageLevel *)__args_13,(bool *)&local_228,
               (cmListFileBacktrace *)(local_240 + 0x17));
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_240);
    std::__cxx11::string::~string(local_220);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1f8);
    pcVar1 = (cmMakefile *)(runtimeDependencySet_local->Name)._M_string_length;
    std::unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>>::
    unique_ptr<cmInstallRuntimeDependencySetGenerator,std::default_delete<cmInstallRuntimeDependencySetGenerator>,void>
              ((unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>> *)&local_248,
               &local_1d8);
    cmMakefile::AddInstallGenerator(pcVar1,&local_248);
    std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>::~unique_ptr
              (&local_248);
    *installsFramework = true;
    std::
    unique_ptr<cmInstallRuntimeDependencySetGenerator,_std::default_delete<cmInstallRuntimeDependencySetGenerator>_>
    ::~unique_ptr(&local_1d8);
  }
  std::
  unique_ptr<cmInstallRuntimeDependencySetGenerator,_std::default_delete<cmInstallRuntimeDependencySetGenerator>_>
  ::~unique_ptr((unique_ptr<cmInstallRuntimeDependencySetGenerator,_std::default_delete<cmInstallRuntimeDependencySetGenerator>_>
                 *)((long)&local_144 + 4));
  std::
  unique_ptr<cmInstallGetRuntimeDependenciesGenerator,_std::default_delete<cmInstallGetRuntimeDependenciesGenerator>_>
  ::~unique_ptr(&local_f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c8);
  return;
}

Assistant:

void AddInstallRuntimeDependenciesGenerator(
  Helper& helper, cmInstallRuntimeDependencySet* runtimeDependencySet,
  const cmInstallCommandArguments& runtimeArgs,
  const cmInstallCommandArguments& libraryArgs,
  const cmInstallCommandArguments& frameworkArgs,
  RuntimeDependenciesArgs runtimeDependenciesArgs, bool& installsRuntime,
  bool& installsLibrary, bool& installsFramework)
{
  bool dllPlatform =
    !helper.Makefile->GetSafeDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX").empty();
  bool apple =
    helper.Makefile->GetSafeDefinition("CMAKE_HOST_SYSTEM_NAME") == "Darwin";
  auto const& runtimeDependenciesArgsRef =
    dllPlatform ? runtimeArgs : libraryArgs;
  std::vector<std::string> configurations =
    runtimeDependenciesArgsRef.GetConfigurations();
  if (apple) {
    std::copy(frameworkArgs.GetConfigurations().begin(),
              frameworkArgs.GetConfigurations().end(),
              std::back_inserter(configurations));
  }

  // Create file(GET_RUNTIME_DEPENDENCIES) generator.
  auto getRuntimeDependenciesGenerator =
    cm::make_unique<cmInstallGetRuntimeDependenciesGenerator>(
      runtimeDependencySet, std::move(runtimeDependenciesArgs.Directories),
      std::move(runtimeDependenciesArgs.PreIncludeRegexes),
      std::move(runtimeDependenciesArgs.PreExcludeRegexes),
      std::move(runtimeDependenciesArgs.PostIncludeRegexes),
      std::move(runtimeDependenciesArgs.PostExcludeRegexes),
      std::move(runtimeDependenciesArgs.PostIncludeFiles),
      std::move(runtimeDependenciesArgs.PostExcludeFiles),
      runtimeDependenciesArgsRef.GetComponent(),
      apple ? frameworkArgs.GetComponent() : "", true, "_CMAKE_DEPS",
      "_CMAKE_RPATH", configurations,
      cmInstallGenerator::SelectMessageLevel(helper.Makefile),
      runtimeDependenciesArgsRef.GetExcludeFromAll() &&
        (apple ? frameworkArgs.GetExcludeFromAll() : true),
      helper.Makefile->GetBacktrace());
  helper.Makefile->AddInstallGenerator(
    std::move(getRuntimeDependenciesGenerator));

  // Create the library dependencies generator.
  auto libraryRuntimeDependenciesGenerator =
    cm::make_unique<cmInstallRuntimeDependencySetGenerator>(
      cmInstallRuntimeDependencySetGenerator::DependencyType::Library,
      runtimeDependencySet, std::vector<std::string>{}, true, std::string{},
      true, "_CMAKE_DEPS", "_CMAKE_RPATH", "_CMAKE_TMP",
      dllPlatform ? helper.GetRuntimeDestination(&runtimeArgs)
                  : helper.GetLibraryDestination(&libraryArgs),
      runtimeDependenciesArgsRef.GetConfigurations(),
      runtimeDependenciesArgsRef.GetComponent(),
      runtimeDependenciesArgsRef.GetPermissions(),
      cmInstallGenerator::SelectMessageLevel(helper.Makefile),
      runtimeDependenciesArgsRef.GetExcludeFromAll(),
      helper.Makefile->GetBacktrace());
  helper.Makefile->AddInstallGenerator(
    std::move(libraryRuntimeDependenciesGenerator));
  if (dllPlatform) {
    installsRuntime = true;
  } else {
    installsLibrary = true;
  }

  if (apple) {
    // Create the framework dependencies generator.
    auto frameworkRuntimeDependenciesGenerator =
      cm::make_unique<cmInstallRuntimeDependencySetGenerator>(
        cmInstallRuntimeDependencySetGenerator::DependencyType::Framework,
        runtimeDependencySet, std::vector<std::string>{}, true, std::string{},
        true, "_CMAKE_DEPS", "_CMAKE_RPATH", "_CMAKE_TMP",
        frameworkArgs.GetDestination(), frameworkArgs.GetConfigurations(),
        frameworkArgs.GetComponent(), frameworkArgs.GetPermissions(),
        cmInstallGenerator::SelectMessageLevel(helper.Makefile),
        frameworkArgs.GetExcludeFromAll(), helper.Makefile->GetBacktrace());
    helper.Makefile->AddInstallGenerator(
      std::move(frameworkRuntimeDependenciesGenerator));
    installsFramework = true;
  }
}